

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

void twice_close_cb(uv_handle_t *handle)

{
  int iVar1;
  uint uVar2;
  uv_handle_type uVar3;
  int iVar4;
  size_t sVar5;
  uv_loop_t *loop;
  int *piVar6;
  uv_loop_t *loop_00;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_1eb8 [32];
  uv_tty_t uStack_1e98;
  uv_tty_t uStack_1d80;
  uv_loop_t uStack_1c68;
  uv_loop_t *puStack_1940;
  code *pcStack_1938;
  long lStack_1930;
  long lStack_1928;
  undefined1 auStack_1920 [280];
  undefined1 auStack_1808 [280];
  undefined1 auStack_16f0 [1088];
  uv_loop_t *puStack_12b0;
  long lStack_12a0;
  long lStack_1298;
  uint uStack_1290;
  uint uStack_128c;
  uv_tty_t uStack_1288;
  uv_tty_t uStack_1170;
  uv_handle_t *puStack_1058;
  undefined8 uStack_1028;
  uv_handle_t auStack_1020 [64];
  uv_handle_t *puStack_20;
  undefined8 local_18;
  long local_10;
  
  puStack_20 = (uv_handle_t *)0x1d43bc;
  puts("TWICE_CLOSE_CB");
  if (handle == (uv_handle_t *)0x0) {
    puStack_20 = (uv_handle_t *)0x1d43f4;
    twice_close_cb_cold_2();
  }
  else {
    puStack_20 = (uv_handle_t *)0x1d43c9;
    iVar1 = uv_is_active(handle);
    local_10 = (long)iVar1;
    local_18 = 0;
    if (local_10 == 0) {
      twice_close_cb_called = twice_close_cb_called + 1;
      return;
    }
  }
  puStack_20 = (uv_handle_t *)0x1d4401;
  twice_close_cb_cold_1();
  uStack_1028 = 0x1000;
  auStack_1020[0].data._0_1_ = 0;
  puStack_20 = handle;
  sVar5 = strlen((char *)auStack_1020);
  if (sVar5 == 0) {
    iVar1 = uv_os_tmpdir((char *)auStack_1020,&uStack_1028);
    if (iVar1 != 0) goto LAB_001d4608;
    handle = auStack_1020;
    sVar5 = strlen((char *)handle);
    if (sVar5 != uStack_1028) goto LAB_001d4617;
    if ((long)uStack_1028 < 1) goto LAB_001d4626;
    if (*(char *)((long)&auStack_1020[0].data + uStack_1028) != '\0') goto LAB_001d4635;
    if ((uStack_1028 < 2) || (*(char *)((uStack_1028 - 1) + (long)handle) != '/')) {
      uStack_1028 = 1;
      iVar1 = uv_os_tmpdir((char *)auStack_1020,&uStack_1028);
      if (iVar1 != -0x69) goto LAB_001d4644;
      if ((long)uStack_1028 < 2) goto LAB_001d4653;
      iVar1 = uv_os_tmpdir((char *)0x0,&uStack_1028);
      if (iVar1 != -0x16) goto LAB_001d4662;
      iVar1 = uv_os_tmpdir((char *)auStack_1020,(size_t *)0x0);
      if (iVar1 != -0x16) goto LAB_001d4671;
      uStack_1028 = 0;
      iVar1 = uv_os_tmpdir((char *)auStack_1020,&uStack_1028);
      if (iVar1 == -0x16) {
        return;
      }
      goto LAB_001d4680;
    }
  }
  else {
    run_test_tmpdir_cold_1();
LAB_001d4608:
    run_test_tmpdir_cold_2();
LAB_001d4617:
    run_test_tmpdir_cold_3();
LAB_001d4626:
    run_test_tmpdir_cold_4();
LAB_001d4635:
    run_test_tmpdir_cold_5();
LAB_001d4644:
    run_test_tmpdir_cold_6();
LAB_001d4653:
    run_test_tmpdir_cold_7();
LAB_001d4662:
    run_test_tmpdir_cold_8();
LAB_001d4671:
    run_test_tmpdir_cold_9();
LAB_001d4680:
    run_test_tmpdir_cold_10();
  }
  run_test_tmpdir_cold_11();
  puStack_12b0 = (uv_loop_t *)0x1d46b0;
  puStack_1058 = handle;
  loop = uv_default_loop();
  puStack_12b0 = (uv_loop_t *)0x1d46c5;
  uVar2 = open64("/dev/tty",0,0);
  if ((int)uVar2 < 0) {
    puStack_12b0 = (uv_loop_t *)0x1d4af8;
    run_test_tty_cold_24();
    return;
  }
  piVar6 = (int *)(ulong)uVar2;
  puStack_12b0 = (uv_loop_t *)0x1d46e5;
  iVar1 = open64("/dev/tty",1,0);
  if (iVar1 < 0) {
    puStack_12b0 = (uv_loop_t *)0x1d4b02;
    run_test_tty_cold_23();
    return;
  }
  uStack_1288.data = (void *)0x0;
  uStack_1170.data = (void *)0x0;
  puStack_12b0 = (uv_loop_t *)0x1d4752;
  uVar3 = uv_guess_handle(-1);
  uStack_1288.data = (void *)(ulong)uVar3;
  if (uStack_1170.data == uStack_1288.data) {
    uStack_1170.data = (void *)0xe;
    puStack_12b0 = (uv_loop_t *)0x1d4780;
    uVar3 = uv_guess_handle(uVar2);
    uStack_1288.data = (void *)(ulong)uVar3;
    if (uStack_1170.data != uStack_1288.data) goto LAB_001d4b3d;
    uStack_1170.data = (void *)0xe;
    puStack_12b0 = (uv_loop_t *)0x1d47ad;
    uVar3 = uv_guess_handle(iVar1);
    uStack_1288.data = (void *)(ulong)uVar3;
    if (uStack_1170.data != uStack_1288.data) goto LAB_001d4b4f;
    puStack_12b0 = (uv_loop_t *)0x1d47df;
    iVar4 = uv_tty_init(loop,&uStack_1170,uVar2,1);
    uStack_1288.data = (void *)(long)iVar4;
    lStack_12a0 = 0;
    if (uStack_1288.data != (void *)0x0) goto LAB_001d4b61;
    puStack_12b0 = (uv_loop_t *)0x1d480c;
    iVar4 = uv_is_readable((uv_stream_t *)&uStack_1170);
    if (iVar4 == 0) goto LAB_001d4b70;
    puStack_12b0 = (uv_loop_t *)0x1d4821;
    iVar4 = uv_is_writable((uv_stream_t *)&uStack_1170);
    if (iVar4 != 0) goto LAB_001d4b75;
    puStack_12b0 = (uv_loop_t *)0x1d483a;
    iVar1 = uv_tty_init(loop,&uStack_1288,iVar1,0);
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4b7a;
    puStack_12b0 = (uv_loop_t *)0x1d4864;
    iVar1 = uv_is_readable((uv_stream_t *)&uStack_1288);
    if (iVar1 != 0) goto LAB_001d4b89;
    puStack_12b0 = (uv_loop_t *)0x1d4876;
    iVar1 = uv_is_writable((uv_stream_t *)&uStack_1288);
    if (iVar1 == 0) goto LAB_001d4b8e;
    puStack_12b0 = (uv_loop_t *)0x1d4892;
    iVar1 = uv_tty_get_winsize(&uStack_1288,(int *)&uStack_128c,(int *)&uStack_1290);
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4b93;
    puStack_12b0 = (uv_loop_t *)0x1d48c8;
    printf("width=%d height=%d\n",(ulong)uStack_128c,(ulong)uStack_1290);
    if (uStack_128c == 0 && uStack_1290 == 0) {
      puStack_12b0 = (uv_loop_t *)0x1d48e8;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      puStack_12b0 = (uv_loop_t *)0x1d48f2;
      uv_run(loop,UV_RUN_DEFAULT);
      lStack_12a0 = 0;
      puStack_12b0 = (uv_loop_t *)0x1d4903;
      iVar1 = uv_loop_close(loop);
      lStack_1298 = (long)iVar1;
      if (lStack_12a0 == lStack_1298) {
        puStack_12b0 = (uv_loop_t *)0x1d491f;
        uv_library_shutdown();
        return;
      }
      goto LAB_001d4ba2;
    }
    lStack_1298 = 0;
    lStack_12a0 = (long)(int)uStack_128c;
    if ((long)(int)uStack_128c < 1) goto LAB_001d4bb1;
    lStack_12a0 = (long)(int)uStack_1290;
    lStack_1298 = 0;
    if (lStack_12a0 < 1) goto LAB_001d4bc0;
    puStack_12b0 = (uv_loop_t *)0x1d497a;
    iVar1 = uv_tty_set_mode(&uStack_1170,UV_TTY_MODE_RAW);
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4bcf;
    puStack_12b0 = (uv_loop_t *)0x1d49a9;
    iVar1 = uv_tty_set_mode(&uStack_1170,UV_TTY_MODE_NORMAL);
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4bde;
    puStack_12b0 = (uv_loop_t *)0x1d49ce;
    piVar6 = __errno_location();
    *piVar6 = 0;
    puStack_12b0 = (uv_loop_t *)0x1d49dc;
    iVar1 = uv_tty_reset_mode();
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4bed;
    puStack_12b0 = (uv_loop_t *)0x1d4a01;
    iVar1 = uv_tty_reset_mode();
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4bfc;
    puStack_12b0 = (uv_loop_t *)0x1d4a26;
    iVar1 = uv_tty_reset_mode();
    lStack_12a0 = (long)iVar1;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4c0b;
    lStack_12a0 = (long)*piVar6;
    lStack_1298 = 0;
    if (lStack_12a0 != 0) goto LAB_001d4c1a;
    piVar6 = (int *)0x0;
    puStack_12b0 = (uv_loop_t *)0x1d4a79;
    uv_close((uv_handle_t *)&uStack_1170,(uv_close_cb)0x0);
    puStack_12b0 = (uv_loop_t *)0x1d4a85;
    uv_close((uv_handle_t *)&uStack_1288,(uv_close_cb)0x0);
    puStack_12b0 = (uv_loop_t *)0x1d4a8f;
    uv_run(loop,UV_RUN_DEFAULT);
    puStack_12b0 = (uv_loop_t *)0x1d4a94;
    loop = uv_default_loop();
    puStack_12b0 = (uv_loop_t *)0x1d4aa8;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_12b0 = (uv_loop_t *)0x1d4ab2;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_12a0 = 0;
    puStack_12b0 = (uv_loop_t *)0x1d4ac0;
    loop_00 = uv_default_loop();
    puStack_12b0 = (uv_loop_t *)0x1d4ac8;
    iVar1 = uv_loop_close(loop_00);
    lStack_1298 = (long)iVar1;
    if (lStack_12a0 == lStack_1298) {
      puStack_12b0 = (uv_loop_t *)0x1d4ae4;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_12b0 = (uv_loop_t *)0x1d4b3d;
    run_test_tty_cold_1();
LAB_001d4b3d:
    puStack_12b0 = (uv_loop_t *)0x1d4b4f;
    run_test_tty_cold_2();
LAB_001d4b4f:
    puStack_12b0 = (uv_loop_t *)0x1d4b61;
    run_test_tty_cold_3();
LAB_001d4b61:
    puStack_12b0 = (uv_loop_t *)0x1d4b70;
    run_test_tty_cold_4();
LAB_001d4b70:
    puStack_12b0 = (uv_loop_t *)0x1d4b75;
    run_test_tty_cold_20();
LAB_001d4b75:
    puStack_12b0 = (uv_loop_t *)0x1d4b7a;
    run_test_tty_cold_5();
LAB_001d4b7a:
    puStack_12b0 = (uv_loop_t *)0x1d4b89;
    run_test_tty_cold_6();
LAB_001d4b89:
    puStack_12b0 = (uv_loop_t *)0x1d4b8e;
    run_test_tty_cold_7();
LAB_001d4b8e:
    puStack_12b0 = (uv_loop_t *)0x1d4b93;
    run_test_tty_cold_19();
LAB_001d4b93:
    puStack_12b0 = (uv_loop_t *)0x1d4ba2;
    run_test_tty_cold_8();
LAB_001d4ba2:
    puStack_12b0 = (uv_loop_t *)0x1d4bb1;
    run_test_tty_cold_18();
LAB_001d4bb1:
    puStack_12b0 = (uv_loop_t *)0x1d4bc0;
    run_test_tty_cold_9();
LAB_001d4bc0:
    puStack_12b0 = (uv_loop_t *)0x1d4bcf;
    run_test_tty_cold_10();
LAB_001d4bcf:
    puStack_12b0 = (uv_loop_t *)0x1d4bde;
    run_test_tty_cold_11();
LAB_001d4bde:
    puStack_12b0 = (uv_loop_t *)0x1d4bed;
    run_test_tty_cold_12();
LAB_001d4bed:
    puStack_12b0 = (uv_loop_t *)0x1d4bfc;
    run_test_tty_cold_13();
LAB_001d4bfc:
    puStack_12b0 = (uv_loop_t *)0x1d4c0b;
    run_test_tty_cold_14();
LAB_001d4c0b:
    puStack_12b0 = (uv_loop_t *)0x1d4c1a;
    run_test_tty_cold_15();
LAB_001d4c1a:
    puStack_12b0 = (uv_loop_t *)0x1d4c29;
    run_test_tty_cold_16();
  }
  puStack_12b0 = (uv_loop_t *)run_test_tty_file;
  run_test_tty_cold_17();
  pcStack_1938 = (code *)0x1d4c4d;
  puStack_12b0 = loop;
  iVar1 = uv_loop_init((uv_loop_t *)(auStack_16f0 + 0x118));
  auStack_16f0._0_8_ = SEXT48(iVar1);
  auStack_1808._0_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStack_16f0._0_8_ == (uv__queue *)0x0) {
    pcStack_1938 = (code *)0x1d4c89;
    uVar2 = open64("test/fixtures/empty_file",0);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      auStack_1808._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_1938 = (code *)0x1d4cbc;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      if (auStack_1808._0_8_ != auStack_1920._0_8_) goto LAB_001d5193;
      pcStack_1938 = (code *)0x1d4cdd;
      iVar1 = close(uVar2);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ != (uv__queue *)0x0) goto LAB_001d51a5;
      auStack_1808._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_1938 = (code *)0x1d4d2b;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      if (auStack_1808._0_8_ == auStack_1920._0_8_) goto LAB_001d4d45;
      goto LAB_001d51c9;
    }
LAB_001d4d45:
    pcStack_1938 = (code *)0x1d4d55;
    uVar2 = open64("/dev/random",0);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      auStack_1808._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_1938 = (code *)0x1d4d84;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      if (auStack_1808._0_8_ != auStack_1920._0_8_) goto LAB_001d51b7;
      pcStack_1938 = (code *)0x1d4da5;
      iVar1 = close(uVar2);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ == (uv__queue *)0x0) goto LAB_001d4dcb;
      goto LAB_001d51db;
    }
LAB_001d4dcb:
    pcStack_1938 = (code *)0x1d4ddb;
    uVar2 = open64("/dev/zero",0);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      auStack_1808._0_8_ = (uv__queue *)0xffffffffffffffea;
      pcStack_1938 = (code *)0x1d4e0a;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      if (auStack_1808._0_8_ != auStack_1920._0_8_) goto LAB_001d51ed;
      pcStack_1938 = (code *)0x1d4e2b;
      iVar1 = close(uVar2);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ == (uv__queue *)0x0) goto LAB_001d4e51;
      goto LAB_001d51ff;
    }
LAB_001d4e51:
    pcStack_1938 = (code *)0x1d4e64;
    uVar2 = open64("/dev/tty",2);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      pcStack_1938 = (code *)0x1d4e8b;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_16f0,uVar2,1);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ != (uv__queue *)0x0) goto LAB_001d5211;
      pcStack_1938 = (code *)0x1d4eb8;
      iVar1 = close(uVar2);
      auStack_1808._0_8_ = SEXT48(iVar1);
      auStack_1920._0_8_ = (uv__queue *)0x0;
      if ((uv__queue *)auStack_1808._0_8_ != (uv__queue *)0x0) goto LAB_001d5223;
      pcStack_1938 = (code *)0x1d4eeb;
      iVar1 = uv_is_readable((uv_stream_t *)auStack_16f0);
      if (iVar1 == 0) goto LAB_001d5235;
      pcStack_1938 = (code *)0x1d4f00;
      iVar1 = uv_is_writable((uv_stream_t *)auStack_16f0);
      if (iVar1 == 0) goto LAB_001d523a;
      loop = (uv_loop_t *)auStack_16f0;
      pcStack_1938 = (code *)0x1d4f1a;
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      pcStack_1938 = (code *)0x1d4f22;
      iVar1 = uv_is_readable((uv_stream_t *)loop);
      if (iVar1 != 0) goto LAB_001d524c;
      pcStack_1938 = (code *)0x1d4f37;
      iVar1 = uv_is_writable((uv_stream_t *)auStack_16f0);
      if (iVar1 == 0) goto LAB_001d4f3f;
      goto LAB_001d525e;
    }
LAB_001d4f3f:
    pcStack_1938 = (code *)0x1d4f4f;
    uVar2 = open64("/dev/tty",0);
    if (uVar2 != 0xffffffff) {
      loop = (uv_loop_t *)(ulong)uVar2;
      pcStack_1938 = (code *)0x1d4f76;
      iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_1808,uVar2,1);
      auStack_1920._0_8_ = SEXT48(iVar1);
      lStack_1930 = 0;
      if ((uv__queue *)auStack_1920._0_8_ != (uv__queue *)0x0) goto LAB_001d523f;
      pcStack_1938 = (code *)0x1d4f9b;
      iVar1 = close(uVar2);
      auStack_1920._0_8_ = SEXT48(iVar1);
      lStack_1930 = 0;
      if ((uv__queue *)auStack_1920._0_8_ != (uv__queue *)0x0) goto LAB_001d5251;
      pcStack_1938 = (code *)0x1d4fc6;
      iVar1 = uv_is_readable((uv_stream_t *)auStack_1808);
      if (iVar1 == 0) goto LAB_001d5263;
      pcStack_1938 = (code *)0x1d4fdb;
      iVar1 = uv_is_writable((uv_stream_t *)auStack_1808);
      if (iVar1 != 0) goto LAB_001d5268;
      loop = (uv_loop_t *)auStack_1808;
      pcStack_1938 = (code *)0x1d4ff5;
      uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
      pcStack_1938 = (code *)0x1d4ffd;
      iVar1 = uv_is_readable((uv_stream_t *)loop);
      if (iVar1 != 0) goto LAB_001d527a;
      pcStack_1938 = (code *)0x1d5012;
      iVar1 = uv_is_writable((uv_stream_t *)auStack_1808);
      if (iVar1 == 0) goto LAB_001d501a;
      goto LAB_001d528c;
    }
LAB_001d501a:
    pcStack_1938 = (code *)0x1d502d;
    uVar2 = open64("/dev/tty",1);
    if (uVar2 == 0xffffffff) {
LAB_001d50e6:
      pcStack_1938 = (code *)0x1d50f5;
      iVar1 = uv_run((uv_loop_t *)(auStack_16f0 + 0x118),UV_RUN_DEFAULT);
      lStack_1930 = (long)iVar1;
      lStack_1928 = 0;
      if (lStack_1930 != 0) goto LAB_001d5179;
      loop = (uv_loop_t *)(auStack_16f0 + 0x118);
      pcStack_1938 = (code *)0x1d5128;
      uv_walk(loop,close_walk_cb,(void *)0x0);
      pcStack_1938 = (code *)0x1d5132;
      uv_run(loop,UV_RUN_DEFAULT);
      lStack_1930 = 0;
      pcStack_1938 = (code *)0x1d5142;
      iVar1 = uv_loop_close(loop);
      lStack_1928 = (long)iVar1;
      if (lStack_1930 == lStack_1928) {
        pcStack_1938 = (code *)0x1d5159;
        uv_library_shutdown();
        return;
      }
      goto LAB_001d5186;
    }
    loop = (uv_loop_t *)(ulong)uVar2;
    pcStack_1938 = (code *)0x1d504e;
    iVar1 = uv_tty_init((uv_loop_t *)(auStack_16f0 + 0x118),(uv_tty_t *)auStack_1920,uVar2,0);
    lStack_1930 = (long)iVar1;
    lStack_1928 = 0;
    if (lStack_1930 != 0) goto LAB_001d526d;
    pcStack_1938 = (code *)0x1d5073;
    iVar1 = close(uVar2);
    lStack_1930 = (long)iVar1;
    lStack_1928 = 0;
    if (lStack_1930 != 0) goto LAB_001d527f;
    pcStack_1938 = (code *)0x1d509b;
    iVar1 = uv_is_readable((uv_stream_t *)auStack_1920);
    if (iVar1 != 0) goto LAB_001d5291;
    pcStack_1938 = (code *)0x1d50ad;
    iVar1 = uv_is_writable((uv_stream_t *)auStack_1920);
    if (iVar1 == 0) goto LAB_001d5296;
    loop = (uv_loop_t *)auStack_1920;
    pcStack_1938 = (code *)0x1d50c4;
    uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
    pcStack_1938 = (code *)0x1d50cc;
    iVar1 = uv_is_readable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_001d529b;
    pcStack_1938 = (code *)0x1d50de;
    iVar1 = uv_is_writable((uv_stream_t *)auStack_1920);
    if (iVar1 == 0) goto LAB_001d50e6;
  }
  else {
    pcStack_1938 = (code *)0x1d5179;
    run_test_tty_file_cold_1();
LAB_001d5179:
    pcStack_1938 = (code *)0x1d5186;
    run_test_tty_file_cold_27();
LAB_001d5186:
    pcStack_1938 = (code *)0x1d5193;
    run_test_tty_file_cold_28();
LAB_001d5193:
    pcStack_1938 = (code *)0x1d51a5;
    run_test_tty_file_cold_2();
LAB_001d51a5:
    pcStack_1938 = (code *)0x1d51b7;
    run_test_tty_file_cold_3();
LAB_001d51b7:
    pcStack_1938 = (code *)0x1d51c9;
    run_test_tty_file_cold_5();
LAB_001d51c9:
    pcStack_1938 = (code *)0x1d51db;
    run_test_tty_file_cold_4();
LAB_001d51db:
    pcStack_1938 = (code *)0x1d51ed;
    run_test_tty_file_cold_6();
LAB_001d51ed:
    pcStack_1938 = (code *)0x1d51ff;
    run_test_tty_file_cold_7();
LAB_001d51ff:
    pcStack_1938 = (code *)0x1d5211;
    run_test_tty_file_cold_8();
LAB_001d5211:
    pcStack_1938 = (code *)0x1d5223;
    run_test_tty_file_cold_9();
LAB_001d5223:
    pcStack_1938 = (code *)0x1d5235;
    run_test_tty_file_cold_10();
LAB_001d5235:
    pcStack_1938 = (code *)0x1d523a;
    run_test_tty_file_cold_14();
LAB_001d523a:
    pcStack_1938 = (code *)0x1d523f;
    run_test_tty_file_cold_13();
LAB_001d523f:
    pcStack_1938 = (code *)0x1d524c;
    run_test_tty_file_cold_15();
LAB_001d524c:
    pcStack_1938 = (code *)0x1d5251;
    run_test_tty_file_cold_11();
LAB_001d5251:
    pcStack_1938 = (code *)0x1d525e;
    run_test_tty_file_cold_16();
LAB_001d525e:
    pcStack_1938 = (code *)0x1d5263;
    run_test_tty_file_cold_12();
LAB_001d5263:
    pcStack_1938 = (code *)0x1d5268;
    run_test_tty_file_cold_20();
LAB_001d5268:
    pcStack_1938 = (code *)0x1d526d;
    run_test_tty_file_cold_17();
LAB_001d526d:
    pcStack_1938 = (code *)0x1d527a;
    run_test_tty_file_cold_21();
LAB_001d527a:
    pcStack_1938 = (code *)0x1d527f;
    run_test_tty_file_cold_18();
LAB_001d527f:
    pcStack_1938 = (code *)0x1d528c;
    run_test_tty_file_cold_22();
LAB_001d528c:
    pcStack_1938 = (code *)0x1d5291;
    run_test_tty_file_cold_19();
LAB_001d5291:
    pcStack_1938 = (code *)0x1d5296;
    run_test_tty_file_cold_23();
LAB_001d5296:
    pcStack_1938 = (code *)0x1d529b;
    run_test_tty_file_cold_26();
LAB_001d529b:
    pcStack_1938 = (code *)0x1d52a0;
    run_test_tty_file_cold_24();
  }
  pcStack_1938 = run_test_tty_pty;
  run_test_tty_file_cold_25();
  handle_00 = (uv_handle_t *)auStack_1eb8;
  puStack_1940 = loop;
  pcStack_1938 = (code *)piVar6;
  iVar1 = uv_loop_init(&uStack_1c68);
  uStack_1e98.data = (void *)(long)iVar1;
  uStack_1d80.data = (void *)0x0;
  if ((uv__queue *)uStack_1e98.data == (uv__queue *)0x0) {
    iVar1 = openpty(auStack_1eb8 + 0x14,auStack_1eb8 + 0x10,0,0,auStack_1eb8 + 0x18);
    if (iVar1 != 0) {
      run_test_tty_pty_cold_2();
      return;
    }
    iVar1 = uv_tty_init(&uStack_1c68,&uStack_1d80,auStack_1eb8._16_4_,0);
    uStack_1e98.data = (void *)(long)iVar1;
    auStack_1eb8._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStack_1e98.data != (uv__queue *)0x0) goto LAB_001d5503;
    iVar1 = uv_tty_init(&uStack_1c68,(uv_tty_t *)(auStack_1eb8 + 0x20),auStack_1eb8._20_4_,0);
    auStack_1eb8._0_8_ = SEXT48(iVar1);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5510;
    iVar1 = uv_is_readable((uv_stream_t *)&uStack_1d80);
    if (iVar1 == 0) goto LAB_001d551d;
    iVar1 = uv_is_writable((uv_stream_t *)&uStack_1d80);
    if (iVar1 == 0) goto LAB_001d5522;
    iVar1 = uv_is_readable((uv_stream_t *)(auStack_1eb8 + 0x20));
    if (iVar1 == 0) goto LAB_001d5527;
    iVar1 = uv_is_writable((uv_stream_t *)(auStack_1eb8 + 0x20));
    if (iVar1 == 0) goto LAB_001d552c;
    auStack_1eb8._0_8_ = ZEXT48(uStack_1d80.flags & 0x100000);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5531;
    if ((uStack_1e98.flags._2_1_ & 0x10) == 0) goto LAB_001d553e;
    iVar1 = close(auStack_1eb8._16_4_);
    auStack_1eb8._0_8_ = SEXT48(iVar1);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5543;
    uv_close((uv_handle_t *)&uStack_1d80,(uv_close_cb)0x0);
    iVar1 = close(auStack_1eb8._20_4_);
    auStack_1eb8._0_8_ = SEXT48(iVar1);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ != (uv_loop_t *)0x0) goto LAB_001d5550;
    uv_close((uv_handle_t *)(auStack_1eb8 + 0x20),(uv_close_cb)0x0);
    iVar1 = uv_run(&uStack_1c68,UV_RUN_DEFAULT);
    auStack_1eb8._0_8_ = SEXT48(iVar1);
    auStack_1eb8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1eb8._0_8_ == (uv_loop_t *)0x0) {
      uv_walk(&uStack_1c68,close_walk_cb,(void *)0x0);
      uv_run(&uStack_1c68,UV_RUN_DEFAULT);
      auStack_1eb8._0_8_ = (uv_loop_t *)0x0;
      iVar1 = uv_loop_close(&uStack_1c68);
      auStack_1eb8._8_8_ = SEXT48(iVar1);
      if (auStack_1eb8._0_8_ == auStack_1eb8._8_8_) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001d556a;
    }
  }
  else {
    run_test_tty_pty_cold_1();
LAB_001d5503:
    run_test_tty_pty_cold_3();
LAB_001d5510:
    run_test_tty_pty_cold_4();
LAB_001d551d:
    run_test_tty_pty_cold_14();
LAB_001d5522:
    run_test_tty_pty_cold_13();
LAB_001d5527:
    run_test_tty_pty_cold_12();
LAB_001d552c:
    run_test_tty_pty_cold_11();
LAB_001d5531:
    run_test_tty_pty_cold_5();
LAB_001d553e:
    run_test_tty_pty_cold_10();
LAB_001d5543:
    run_test_tty_pty_cold_6();
LAB_001d5550:
    run_test_tty_pty_cold_7();
  }
  run_test_tty_pty_cold_8();
LAB_001d556a:
  run_test_tty_pty_cold_9();
  iVar1 = uv_is_closing(handle_00);
  if (iVar1 == 0) {
    uv_close(handle_00,(uv_close_cb)0x0);
    return;
  }
  return;
}

Assistant:

static void twice_close_cb(uv_handle_t* handle) {
  printf("TWICE_CLOSE_CB\n");

  ASSERT_NOT_NULL(handle);
  ASSERT_OK(uv_is_active(handle));

  twice_close_cb_called++;
}